

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode
JsParse(JsValueRef scriptVal,JsSourceContext sourceContext,JsValueRef sourceUrl,
       JsParseScriptAttributes parseAttributes,JsValueRef *result)

{
  anon_class_48_6_2009d855 fn;
  bool bVar1;
  uint uVar2;
  JsErrorCode JVar3;
  LoadScriptFlag loadScriptFlag;
  JsValueRef local_58;
  WCHAR *local_50;
  WCHAR *url;
  byte *script;
  size_t cb;
  undefined1 local_29 [8];
  bool isString;
  
  JVar3 = JsErrorNullArgument;
  if (sourceUrl != (JsValueRef)0x0 && scriptVal != (JsValueRef)0x0) {
    local_58 = sourceUrl;
    cb = (size_t)scriptVal;
    bVar1 = Js::VarIs<Js::ArrayBuffer>(scriptVal);
    local_29[0] = 0;
    if (bVar1) {
      url = (WCHAR *)(**(code **)(*(long *)cb + 0x390))();
      uVar2 = (**(code **)(*(long *)cb + 0x388))();
      script = (byte *)(ulong)uVar2;
      loadScriptFlag =
           ((parseAttributes & JsParseScriptAttributeArrayBufferIsUtf16Encoded) ==
            JsParseScriptAttributeNone | 4) << 6;
    }
    else {
      local_29[0] = Js::VarIs<Js::JavascriptString>((Var)cb);
      loadScriptFlag = LoadScriptFlag_None;
      if (!(bool)local_29[0]) {
        return JsErrorInvalidArgument;
      }
    }
    fn.scriptVal._0_1_ = (char)&url;
    fn.isString = (bool *)&cb;
    fn.scriptVal._1_7_ = (int7)((ulong)&url >> 8);
    fn.script._0_4_ = (int)&script;
    fn.script._4_4_ = (int)((ulong)&script >> 0x20);
    fn.cb._0_1_ = (char)&local_58;
    fn.cb._1_7_ = (int7)((ulong)&local_58 >> 8);
    fn.sourceUrl = &local_50;
    fn.url = (WCHAR **)local_29;
    JVar3 = GlobalAPIWrapper_NoRecord<CompileRun(void*,unsigned_long,void*,_JsParseScriptAttributes,void**,bool)::__0>
                      (fn);
    if (JVar3 == JsNoError) {
      JVar3 = RunScriptCore((JsValueRef)cb,(byte *)url,(size_t)script,loadScriptFlag,sourceContext,
                            local_50,true,parseAttributes,false,result);
    }
  }
  return JVar3;
}

Assistant:

CHAKRA_API JsParse(
    _In_ JsValueRef scriptVal,
    _In_ JsSourceContext sourceContext,
    _In_ JsValueRef sourceUrl,
    _In_ JsParseScriptAttributes parseAttributes,
    _Out_ JsValueRef *result)
{
    return CompileRun(scriptVal, sourceContext, sourceUrl, parseAttributes,
        result, true);
}